

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main_impl.h
# Opt level: O0

int secp256k1_ecdsa_adaptor_verify
              (secp256k1_context *ctx,uchar *adaptor_sig162,secp256k1_pubkey *pubkey,uchar *msg32,
              secp256k1_pubkey *enckey)

{
  int iVar1;
  long in_RCX;
  long in_RDX;
  secp256k1_gej *in_RSI;
  long in_R8;
  secp256k1_gej pubkeyj;
  secp256k1_scalar u2;
  secp256k1_scalar u1;
  secp256k1_scalar sn;
  secp256k1_gej derived_rp;
  secp256k1_ge enckey_ge;
  secp256k1_scalar sigr;
  secp256k1_scalar sp;
  secp256k1_ge rp;
  secp256k1_ge r;
  secp256k1_ge pubkey_ge;
  secp256k1_scalar msg;
  secp256k1_scalar dleq_proof_e;
  secp256k1_scalar dleq_proof_s;
  secp256k1_scalar *in_stack_000008a0;
  secp256k1_scalar *in_stack_000008a8;
  secp256k1_gej *in_stack_000008b0;
  secp256k1_gej *in_stack_000008b8;
  secp256k1_ecmult_context *in_stack_000008c0;
  char *in_stack_fffffffffffffc68;
  secp256k1_gej *in_stack_fffffffffffffc70;
  secp256k1_scalar *in_stack_fffffffffffffc78;
  secp256k1_scalar *in_stack_fffffffffffffc80;
  secp256k1_ge *in_stack_fffffffffffffc88;
  secp256k1_scalar *in_stack_fffffffffffffc90;
  secp256k1_ge *in_stack_fffffffffffffc98;
  secp256k1_scalar *in_stack_fffffffffffffca0;
  secp256k1_pubkey *in_stack_fffffffffffffca8;
  secp256k1_ge *in_stack_fffffffffffffcb0;
  secp256k1_context *in_stack_fffffffffffffcb8;
  secp256k1_gej local_2b0;
  secp256k1_fe *in_stack_fffffffffffffe18;
  secp256k1_ge *in_stack_fffffffffffffe20;
  secp256k1_gej *in_stack_fffffffffffffe28;
  secp256k1_gej *in_stack_fffffffffffffe30;
  int local_4;
  
  if (in_RSI == (secp256k1_gej *)0x0) {
    secp256k1_callback_call
              ((secp256k1_callback *)in_stack_fffffffffffffc70,in_stack_fffffffffffffc68);
    local_4 = 0;
  }
  else if (in_RDX == 0) {
    secp256k1_callback_call
              ((secp256k1_callback *)in_stack_fffffffffffffc70,in_stack_fffffffffffffc68);
    local_4 = 0;
  }
  else if (in_RCX == 0) {
    secp256k1_callback_call
              ((secp256k1_callback *)in_stack_fffffffffffffc70,in_stack_fffffffffffffc68);
    local_4 = 0;
  }
  else if (in_R8 == 0) {
    secp256k1_callback_call
              ((secp256k1_callback *)in_stack_fffffffffffffc70,in_stack_fffffffffffffc68);
    local_4 = 0;
  }
  else {
    iVar1 = secp256k1_ecdsa_adaptor_sig_deserialize
                      (in_stack_fffffffffffffc98,in_stack_fffffffffffffc90,in_stack_fffffffffffffc88
                       ,in_stack_fffffffffffffc80,in_stack_fffffffffffffc78,
                       (secp256k1_scalar *)in_stack_fffffffffffffc70,
                       (uchar *)in_stack_fffffffffffffcb0);
    if (iVar1 == 0) {
      local_4 = 0;
    }
    else {
      iVar1 = secp256k1_pubkey_load
                        (in_stack_fffffffffffffcb8,in_stack_fffffffffffffcb0,
                         in_stack_fffffffffffffca8);
      if (iVar1 == 0) {
        local_4 = 0;
      }
      else {
        iVar1 = secp256k1_dleq_verify
                          ((secp256k1_context *)pubkeyj._120_8_,(secp256k1_scalar *)pubkeyj.z.n[4],
                           (secp256k1_scalar *)pubkeyj.z.n[3],(secp256k1_ge *)pubkeyj.z.n[2],
                           (secp256k1_ge *)pubkeyj.z.n[1],(secp256k1_ge *)pubkeyj.z.n[0]);
        if (iVar1 == 0) {
          local_4 = 0;
        }
        else {
          secp256k1_scalar_set_b32
                    (in_stack_fffffffffffffc80,(uchar *)in_stack_fffffffffffffc78,
                     (int *)in_stack_fffffffffffffc70);
          iVar1 = secp256k1_pubkey_load
                            (in_stack_fffffffffffffcb8,in_stack_fffffffffffffcb0,
                             in_stack_fffffffffffffca8);
          if (iVar1 == 0) {
            local_4 = 0;
          }
          else {
            secp256k1_scalar_inverse_var
                      ((secp256k1_scalar *)in_stack_fffffffffffffc70,(secp256k1_scalar *)in_RSI);
            secp256k1_scalar_mul
                      ((secp256k1_scalar *)in_stack_fffffffffffffcb0,
                       (secp256k1_scalar *)in_stack_fffffffffffffca8,in_stack_fffffffffffffca0);
            secp256k1_scalar_mul
                      ((secp256k1_scalar *)in_stack_fffffffffffffcb0,
                       (secp256k1_scalar *)in_stack_fffffffffffffca8,in_stack_fffffffffffffca0);
            secp256k1_gej_set_ge(in_stack_fffffffffffffc70,(secp256k1_ge *)in_RSI);
            secp256k1_ecmult(in_stack_000008c0,in_stack_000008b8,in_stack_000008b0,in_stack_000008a8
                             ,in_stack_000008a0);
            iVar1 = secp256k1_gej_is_infinity(&local_2b0);
            if (iVar1 == 0) {
              secp256k1_gej_neg(in_stack_fffffffffffffc70,in_RSI);
              secp256k1_gej_add_ge_var
                        (in_stack_fffffffffffffe30,in_stack_fffffffffffffe28,
                         in_stack_fffffffffffffe20,in_stack_fffffffffffffe18);
              local_4 = secp256k1_gej_is_infinity(&local_2b0);
            }
            else {
              local_4 = 0;
            }
          }
        }
      }
    }
  }
  return local_4;
}

Assistant:

int secp256k1_ecdsa_adaptor_verify(const secp256k1_context* ctx, const unsigned char *adaptor_sig162, const secp256k1_pubkey *pubkey, const unsigned char *msg32, const secp256k1_pubkey *enckey) {
    secp256k1_scalar dleq_proof_s, dleq_proof_e;
    secp256k1_scalar msg;
    secp256k1_ge pubkey_ge;
    secp256k1_ge r, rp;
    secp256k1_scalar sp;
    secp256k1_scalar sigr;
    secp256k1_ge enckey_ge;
    secp256k1_gej derived_rp;
    secp256k1_scalar sn, u1, u2;
    secp256k1_gej pubkeyj;

    VERIFY_CHECK(ctx != NULL);
    ARG_CHECK(adaptor_sig162 != NULL);
    ARG_CHECK(pubkey != NULL);
    ARG_CHECK(msg32 != NULL);
    ARG_CHECK(enckey != NULL);

    if (!secp256k1_ecdsa_adaptor_sig_deserialize(&r, &sigr, &rp, &sp, &dleq_proof_e, &dleq_proof_s, adaptor_sig162)) {
        return 0;
    }
    if (!secp256k1_pubkey_load(ctx, &enckey_ge, enckey)) {
        return 0;
    }
    /* DLEQ_verify((R', Y, R), dleq_proof) */
    if(!secp256k1_dleq_verify(ctx, &dleq_proof_s, &dleq_proof_e, &rp, &enckey_ge, &r)) {
        return 0;
    }
    secp256k1_scalar_set_b32(&msg, msg32, NULL);
    if (!secp256k1_pubkey_load(ctx, &pubkey_ge, pubkey)) {
        return 0;
    }

    /* return R' == s'⁻¹(m * G + R.x * X) */
    secp256k1_scalar_inverse_var(&sn, &sp);
    secp256k1_scalar_mul(&u1, &sn, &msg);
    secp256k1_scalar_mul(&u2, &sn, &sigr);
    secp256k1_gej_set_ge(&pubkeyj, &pubkey_ge);
    secp256k1_ecmult(ctx, &derived_rp, &pubkeyj, &u2, &u1);
    if (secp256k1_gej_is_infinity(&derived_rp)) {
        return 0;
    }
    secp256k1_gej_neg(&derived_rp, &derived_rp);
    secp256k1_gej_add_ge_var(&derived_rp, &derived_rp, &rp, NULL);
    return secp256k1_gej_is_infinity(&derived_rp);
}